

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

int lws_cache_nscookiejar_lookup
              (lws_cache_ttl_lru *_c,char *wildcard_key,lws_dll2_owner_t *results_owner)

{
  int fd;
  int iVar1;
  uint uVar2;
  nsc_lookup_ctx ctx;
  char *local_48;
  lws_dll2_owner_t *local_40;
  undefined8 local_38;
  size_t local_30;
  
  fd = nsc_backing_open_lock((lws_cache_nscookiejar_t *)_c,0x14bb30,(char *)results_owner);
  if (fd < 0) {
    uVar2 = 1;
  }
  else {
    local_48 = wildcard_key;
    local_40 = results_owner;
    local_30 = strlen(wildcard_key);
    local_38 = 0;
    iVar1 = nscookiejar_iterate((lws_cache_nscookiejar_t *)_c,fd,nsc_lookup_cb,&local_48);
    nsc_backing_close_unlock((lws_cache_nscookiejar_t *)_c,fd);
    uVar2 = (uint)(iVar1 == -1);
  }
  return uVar2;
}

Assistant:

static int
lws_cache_nscookiejar_lookup(struct lws_cache_ttl_lru *_c,
			     const char *wildcard_key,
			     lws_dll2_owner_t *results_owner)
{
	lws_cache_nscookiejar_t *cache = (lws_cache_nscookiejar_t *)_c;
	struct nsc_lookup_ctx ctx;
	int ret, fd;

	fd = nsc_backing_open_lock(cache, LWS_O_RDONLY, __func__);
	if (fd < 0)
		return 1;

	ctx.wildcard_key = wildcard_key;
	ctx.results_owner = results_owner;
	ctx.wklen = strlen(wildcard_key);
	ctx.match = 0;

	ret = nscookiejar_iterate(cache, fd, nsc_lookup_cb, &ctx);
		/*
		 * The cb can fail, eg, with OOM, making the whole lookup
		 * invalid and returning fail.  Caller will clean
		 * results_owner on fail.
		 */
	nsc_backing_close_unlock(cache, fd);

	return ret == NIR_FINISH_ERROR;
}